

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int cvDoErrorTest(CVodeMem cv_mem,int *nflagPtr,sunrealtype saved_t,sunrealtype acor_nrm,int *nefPtr
                 ,long *netfPtr,sunrealtype *dsmPtr)

{
  sunrealtype *psVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar5 = acor_nrm * cv_mem->cv_tq[2];
  *dsmPtr = dVar5;
  if (dVar5 <= 1.0) {
    return 0;
  }
  *nefPtr = *nefPtr + 1;
  *netfPtr = *netfPtr + 1;
  *nflagPtr = 9;
  cvRestore(cv_mem,saved_t);
  dVar6 = ABS(cv_mem->cv_h);
  if (dVar6 <= cv_mem->cv_hmin * 1.000001) {
    return -3;
  }
  iVar2 = *nefPtr;
  if (iVar2 == cv_mem->cv_maxnef) {
    return -3;
  }
  cv_mem->cv_etamax = 1.0;
  if (iVar2 < 4) {
    dVar5 = (double)SUNRpowerR(dVar5 * 6.0,1.0 / (double)cv_mem->cv_L);
    auVar7._8_8_ = cv_mem->cv_hmin;
    auVar7._0_8_ = 0x3ff0000000000000;
    auVar8._8_8_ = ABS(cv_mem->cv_h);
    auVar8._0_8_ = dVar5 + 1e-06;
    auVar8 = divpd(auVar7,auVar8);
    dVar5 = auVar8._0_8_;
    if (auVar8._0_8_ <= auVar8._8_8_) {
      dVar5 = auVar8._8_8_;
    }
    dVar6 = cv_mem->cv_eta_min_ef;
    if (cv_mem->cv_eta_min_ef <= dVar5) {
      dVar6 = dVar5;
    }
    cv_mem->cv_eta = dVar6;
    if (cv_mem->cv_small_nef <= *nefPtr) {
      if (cv_mem->cv_eta_max_ef <= dVar6) {
        dVar6 = cv_mem->cv_eta_max_ef;
      }
      cv_mem->cv_eta = dVar6;
    }
  }
  else {
    dVar6 = cv_mem->cv_hmin / dVar6;
    dVar5 = cv_mem->cv_eta_min_ef;
    if (cv_mem->cv_eta_min_ef <= dVar6) {
      dVar5 = dVar6;
    }
    cv_mem->cv_eta = dVar5;
    if (cv_mem->cv_q < 2) {
      dVar5 = cv_mem->cv_h * dVar5;
      cv_mem->cv_h = dVar5;
      cv_mem->cv_next_h = dVar5;
      cv_mem->cv_hscale = dVar5;
      cv_mem->cv_qwait = 10;
      cv_mem->cv_nscon = 0;
      iVar2 = (*cv_mem->cv_f)(cv_mem->cv_tn,cv_mem->cv_zn[0],cv_mem->cv_tempv,cv_mem->cv_user_data);
      cv_mem->cv_nfe = cv_mem->cv_nfe + 1;
      if (iVar2 < 0) {
        return -8;
      }
      if (iVar2 != 0) {
        return -0xb;
      }
      N_VScale(cv_mem->cv_h,cv_mem->cv_tempv,cv_mem->cv_zn[1]);
      if (cv_mem->cv_quadr != 0) {
        iVar2 = (*cv_mem->cv_fQ)(cv_mem->cv_tn,cv_mem->cv_zn[0],cv_mem->cv_tempvQ,
                                 cv_mem->cv_user_data);
        cv_mem->cv_nfQe = cv_mem->cv_nfQe + 1;
        if (iVar2 < 0) {
          return -0x1f;
        }
        if (iVar2 != 0) {
          return -0x22;
        }
        N_VScale(cv_mem->cv_h,cv_mem->cv_tempvQ,cv_mem->cv_znQ[1]);
      }
      if (cv_mem->cv_sensi != 0) {
        iVar2 = cvSensRhsWrapper(cv_mem,cv_mem->cv_tn,cv_mem->cv_zn[0],cv_mem->cv_tempv,
                                 cv_mem->cv_znS[0],cv_mem->cv_tempvS,cv_mem->cv_ftemp,
                                 *cv_mem->cv_ftempS);
        if (iVar2 < 0) {
          return -0x29;
        }
        if (iVar2 != 0) {
          return -0x2c;
        }
        lVar4 = (long)cv_mem->cv_Ns;
        if (0 < lVar4) {
          psVar1 = cv_mem->cv_cvals;
          lVar3 = 0;
          do {
            psVar1[lVar3] = cv_mem->cv_h;
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        iVar2 = N_VScaleVectorArray(lVar4,cv_mem->cv_cvals,cv_mem->cv_tempvS,cv_mem->cv_znS[1]);
        if (iVar2 != 0) {
          return -0x1c;
        }
      }
      if (cv_mem->cv_quadr_sensi == 0) {
        return 5;
      }
      iVar2 = (*cv_mem->cv_fQS)(cv_mem->cv_Ns,cv_mem->cv_tn,cv_mem->cv_zn[0],cv_mem->cv_znS[0],
                                cv_mem->cv_tempvQ,cv_mem->cv_tempvQS,cv_mem->cv_fQS_data,
                                cv_mem->cv_ftemp,cv_mem->cv_ftempQ);
      cv_mem->cv_nfQSe = cv_mem->cv_nfQSe + 1;
      if (-1 < iVar2) {
        if (iVar2 != 0) {
          return -0x36;
        }
        lVar4 = (long)cv_mem->cv_Ns;
        if (0 < lVar4) {
          psVar1 = cv_mem->cv_cvals;
          lVar3 = 0;
          do {
            psVar1[lVar3] = cv_mem->cv_h;
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        iVar2 = N_VScaleVectorArray(lVar4,cv_mem->cv_cvals,cv_mem->cv_tempvQS,cv_mem->cv_znQS[1]);
        if (iVar2 == 0) {
          return 5;
        }
        return -0x1c;
      }
      return -0x33;
    }
    cvAdjustOrder(cv_mem,-1);
    iVar2 = cv_mem->cv_q;
    cv_mem->cv_L = iVar2;
    cv_mem->cv_q = iVar2 + -1;
    cv_mem->cv_qwait = iVar2;
  }
  cvRescale(cv_mem);
  return 5;
}

Assistant:

static int cvDoErrorTest(CVodeMem cv_mem, int* nflagPtr, sunrealtype saved_t,
                         sunrealtype acor_nrm, int* nefPtr, long int* netfPtr,
                         sunrealtype* dsmPtr)
{
  sunrealtype dsm;
  int retval, is;
  N_Vector wrk1, wrk2;

  dsm = acor_nrm * cv_mem->cv_tq[2];

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODES::cvDoErrorTest",
                     "error-test", "step = %li, h = %.16g, dsm = %.16g",
                     cv_mem->cv_nst, cv_mem->cv_h, dsm);
#endif

  /* If est. local error norm dsm passes test, return CV_SUCCESS */
  *dsmPtr = dsm;
  if (dsm <= ONE) { return (CV_SUCCESS); }

  /* Test failed; increment counters, set nflag, and restore zn array */
  (*nefPtr)++;
  (*netfPtr)++;
  *nflagPtr = PREV_ERR_FAIL;
  cvRestore(cv_mem, saved_t);

  /* At maxnef failures or |h| = hmin, return CV_ERR_FAILURE */
  if ((SUNRabs(cv_mem->cv_h) <= cv_mem->cv_hmin * ONEPSM) ||
      (*nefPtr == cv_mem->cv_maxnef))
  {
    return (CV_ERR_FAILURE);
  }

  /* Set etamax = 1 to prevent step size increase at end of this step */
  cv_mem->cv_etamax = ONE;

  /* Set h ratio eta from dsm, rescale, and return for retry of step */
  if (*nefPtr <= MXNEF1)
  {
    cv_mem->cv_eta = ONE / (SUNRpowerR(BIAS2 * dsm, ONE / cv_mem->cv_L) + ADDON);
    cv_mem->cv_eta =
      SUNMAX(cv_mem->cv_eta_min_ef,
             SUNMAX(cv_mem->cv_eta, cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h)));
    if (*nefPtr >= cv_mem->cv_small_nef)
    {
      cv_mem->cv_eta = SUNMIN(cv_mem->cv_eta, cv_mem->cv_eta_max_ef);
    }

    cvRescale(cv_mem);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
    SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODES::cvDoErrorTest",
                       "new-step-eta", "eta = %.16g", cv_mem->cv_eta);
#endif

    return (TRY_AGAIN);
  }

  /* After MXNEF1 failures, force an order reduction and retry step */
  if (cv_mem->cv_q > 1)
  {
    cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_min_ef,
                            cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
    cvAdjustOrder(cv_mem, -1);
    cv_mem->cv_L = cv_mem->cv_q;
    cv_mem->cv_q--;
    cv_mem->cv_qwait = cv_mem->cv_L;
    cvRescale(cv_mem);
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
    SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODES::cvDoErrorTest",
                       "new-step-eta-mxnef1", "eta = %.16g", cv_mem->cv_eta);
#endif
    return (TRY_AGAIN);
  }

  /* If already at order 1, restart: reload zn, znQ, znS, znQS from scratch */

  cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_min_ef,
                          cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
  cv_mem->cv_h *= cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_qwait  = LONG_WAIT;
  cv_mem->cv_nscon  = 0;

  retval = cv_mem->cv_f(cv_mem->cv_tn, cv_mem->cv_zn[0], cv_mem->cv_tempv,
                        cv_mem->cv_user_data);
  cv_mem->cv_nfe++;
  if (retval < 0) { return (CV_RHSFUNC_FAIL); }
  if (retval > 0) { return (CV_UNREC_RHSFUNC_ERR); }

  N_VScale(cv_mem->cv_h, cv_mem->cv_tempv, cv_mem->cv_zn[1]);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODES::cvDoErrorTest",
                     "new-step-eta-mxnef1-q1", "eta = %.16g", cv_mem->cv_eta);
#endif

  if (cv_mem->cv_quadr)
  {
    retval = cv_mem->cv_fQ(cv_mem->cv_tn, cv_mem->cv_zn[0], cv_mem->cv_tempvQ,
                           cv_mem->cv_user_data);
    cv_mem->cv_nfQe++;
    if (retval < 0) { return (CV_QRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_QRHSFUNC_ERR); }

    N_VScale(cv_mem->cv_h, cv_mem->cv_tempvQ, cv_mem->cv_znQ[1]);
  }

  if (cv_mem->cv_sensi)
  {
    wrk1 = cv_mem->cv_ftemp;
    wrk2 = cv_mem->cv_ftempS[0];

    retval = cvSensRhsWrapper(cv_mem, cv_mem->cv_tn, cv_mem->cv_zn[0],
                              cv_mem->cv_tempv, cv_mem->cv_znS[0],
                              cv_mem->cv_tempvS, wrk1, wrk2);
    if (retval < 0) { return (CV_SRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_SRHSFUNC_ERR); }

    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_h;
    }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_tempvS, cv_mem->cv_znS[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  if (cv_mem->cv_quadr_sensi)
  {
    wrk1 = cv_mem->cv_ftemp;
    wrk2 = cv_mem->cv_ftempQ;

    retval = cv_mem->cv_fQS(cv_mem->cv_Ns, cv_mem->cv_tn, cv_mem->cv_zn[0],
                            cv_mem->cv_znS[0], cv_mem->cv_tempvQ,
                            cv_mem->cv_tempvQS, cv_mem->cv_fQS_data, wrk1, wrk2);
    cv_mem->cv_nfQSe++;
    if (retval < 0) { return (CV_QSRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_QSRHSFUNC_ERR); }

    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_h;
    }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_tempvQS, cv_mem->cv_znQS[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (TRY_AGAIN);
}